

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::SetRepeatedString
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,int index,
          string *value)

{
  int iVar1;
  LogMessage *pLVar2;
  string *psVar3;
  LogFinisher local_69;
  LogMessage local_68;
  
  if (*(Descriptor **)(field + 0x38) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetRepeatedString","Field does not match message type.");
  }
  if (*(int *)(field + 0x30) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetRepeatedString",
               "Field is singular; the method requires a repeated field.");
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4) != 9) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"SetRepeatedString",CPPTYPE_STRING);
  }
  if (field[0x34] == (FieldDescriptor)0x1) {
    iVar1 = this->extensions_offset_;
    if (iVar1 == -1) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                 ,0x4b5);
      pLVar2 = LogMessage::operator<<(&local_68,"CHECK failed: (extensions_offset_) != (-1): ");
      LogFinisher::operator=(&local_69,pLVar2);
      LogMessage::~LogMessage(&local_68);
      iVar1 = this->extensions_offset_;
    }
    psVar3 = ExtensionSet::MutableRepeatedString_abi_cxx11_
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (long)iVar1),
                        *(int *)(field + 0x28),index);
  }
  else {
    iVar1 = this->offsets_
            [(int)((ulong)((long)field - *(long *)(*(long *)(field + 0x38) + 0x30)) >> 3) *
             -0x11111111];
    if (*(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + (long)iVar1) <= index) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                 ,0x340);
      pLVar2 = LogMessage::operator<<(&local_68,"CHECK failed: (index) < (size()): ");
      LogFinisher::operator=(&local_69,pLVar2);
      LogMessage::~LogMessage(&local_68);
    }
    psVar3 = *(string **)
              (*(long *)((long)&(message->super_MessageLite)._vptr_MessageLite + (long)iVar1) +
              (long)index * 8);
  }
  std::__cxx11::string::_M_assign((string *)psVar3);
  return;
}

Assistant:

void GeneratedMessageReflection::SetRepeatedString(
    Message* message, const FieldDescriptor* field,
    int index, const string& value) const {
  USAGE_CHECK_ALL(SetRepeatedString, REPEATED, STRING);
  if (field->is_extension()) {
    MutableExtensionSet(message)->SetRepeatedString(
      field->number(), index, value);
  } else {
    switch (field->options().ctype()) {
      default:  // TODO(kenton):  Support other string reps.
      case FieldOptions::STRING:
        *MutableRepeatedField<string>(message, field, index) = value;
        break;
    }
  }
}